

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O1

void test_counts(void)

{
  uint64_t *puVar1;
  long lVar2;
  bool bVar3;
  _Bool _Var4;
  bitset_t *pbVar5;
  bitset_t *pbVar6;
  size_t sVar7;
  bitset_t *pbVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint64_t uVar12;
  long lVar13;
  int k;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong auStack_100 [4];
  bitset_t *pbStack_e0;
  bitset_t *pbStack_d8;
  code *pcStack_d0;
  bitset_t *pbStack_c0;
  undefined8 uStack_b8;
  bitset_t *pbStack_b0;
  code *pcStack_a8;
  bitset_t *pbStack_98;
  bitset_t *pbStack_90;
  bitset_t *pbStack_88;
  ulong uStack_80;
  ulong uStack_78;
  bitset_t *pbStack_70;
  code *pcStack_68;
  bitset_t *pbStack_60;
  long lStack_58;
  ulong uStack_50;
  bitset_t *pbStack_48;
  code *pcStack_40;
  
  pcStack_40 = (code *)0x102047;
  pbVar5 = bitset_create();
  lVar13 = 0;
  pcStack_40 = (code *)0x102052;
  pbVar6 = bitset_create();
  uVar17 = 0;
  uVar14 = 0;
  do {
    uVar9 = uVar14 >> 5;
    if (uVar9 < pbVar5->arraysize) {
LAB_00102078:
      pbVar5->array[uVar9] = pbVar5->array[uVar9] | 1L << ((byte)lVar13 & 0x3e);
    }
    else {
      pcStack_40 = (code *)0x102074;
      _Var4 = bitset_grow(pbVar5,uVar9 + 1);
      if (_Var4) goto LAB_00102078;
    }
    uVar9 = uVar17 >> 6;
    if (uVar9 < pbVar6->arraysize) {
LAB_001020aa:
      pbVar6->array[uVar9] = pbVar6->array[uVar9] | 1L << ((byte)uVar17 & 0x3f);
    }
    else {
      pcStack_40 = (code *)0x1020a6;
      _Var4 = bitset_grow(pbVar6,uVar9 + 1);
      if (_Var4) goto LAB_001020aa;
    }
    uVar14 = uVar14 + 1;
    uVar17 = uVar17 + 3;
    lVar13 = lVar13 + 2;
  } while (uVar14 != 1000);
  pcStack_40 = (code *)0x1020db;
  sVar7 = bitset_intersection_count(pbVar5,pbVar6);
  if (sVar7 == 0x14e) {
    pcStack_40 = (code *)0x1020ee;
    sVar7 = bitset_union_count(pbVar5,pbVar6);
    if (sVar7 == 0x682) {
      pcStack_40 = (code *)0x1020fe;
      bitset_free(pbVar5);
      bitset_free(pbVar6);
      return;
    }
  }
  else {
    pcStack_40 = (code *)0x102119;
    test_counts_cold_1();
  }
  pcStack_40 = test_disjoint;
  test_counts_cold_2();
  pcStack_68 = (code *)0x10212c;
  pbStack_60 = pbVar5;
  lStack_58 = lVar13;
  uStack_50 = uVar14;
  pbStack_48 = pbVar6;
  pcStack_40 = (code *)uVar17;
  pbVar5 = bitset_create();
  uVar14 = 0;
  pcStack_68 = (code *)0x102137;
  pbVar6 = bitset_create();
  do {
    uVar17 = uVar14 >> 6;
    if ((uVar14 & 1) == 0) {
      uVar9 = 0x3e;
      pbVar8 = pbVar5;
      if (uVar17 < pbVar5->arraysize) goto LAB_0010218d;
      pcStack_68 = (code *)0x102175;
      _Var4 = bitset_grow(pbVar5,uVar17 + 1);
LAB_00102189:
      if (_Var4 != false) goto LAB_0010218d;
    }
    else {
      uVar9 = 0x3f;
      pbVar8 = pbVar6;
      if (pbVar6->arraysize <= uVar17) {
        pcStack_68 = (code *)0x102186;
        _Var4 = bitset_grow(pbVar6,uVar17 + 1);
        goto LAB_00102189;
      }
LAB_0010218d:
      uVar16 = (uint)uVar9 & (uint)uVar14;
      uVar9 = (ulong)uVar16;
      pbVar8->array[uVar17] = pbVar8->array[uVar17] | 1L << (sbyte)uVar16;
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 1000);
  pcStack_68 = (code *)0x1021b9;
  _Var4 = bitsets_disjoint(pbVar5,pbVar6);
  if (_Var4) {
    uVar9 = 0x20000000000000;
    if (pbVar5->arraysize < 8) {
      pcStack_68 = (code *)0x1021db;
      _Var4 = bitset_grow(pbVar5,8);
      if (_Var4) goto LAB_001021df;
    }
    else {
LAB_001021df:
      pbVar5->array[7] = pbVar5->array[7] | 0x20000000000000;
    }
    if (pbVar6->arraysize < 8) {
      pcStack_68 = (code *)0x1021fa;
      _Var4 = bitset_grow(pbVar6,8);
      if (_Var4) goto LAB_001021fe;
    }
    else {
LAB_001021fe:
      pbVar6->array[7] = pbVar6->array[7] | 0x20000000000000;
    }
    pcStack_68 = (code *)0x102210;
    _Var4 = bitsets_disjoint(pbVar5,pbVar6);
    if (!_Var4) {
      pcStack_68 = (code *)0x10221c;
      bitset_free(pbVar5);
      bitset_free(pbVar6);
      return;
    }
  }
  else {
    pcStack_68 = (code *)0x102232;
    test_disjoint_cold_1();
  }
  pcStack_68 = test_intersects;
  test_disjoint_cold_2();
  pbStack_90 = (bitset_t *)0x102245;
  pbStack_88 = pbVar5;
  uStack_80 = uVar14;
  uStack_78 = uVar17;
  pbStack_70 = pbVar6;
  pcStack_68 = (code *)uVar9;
  pbVar5 = bitset_create();
  pbStack_90 = (bitset_t *)0x10224d;
  pbVar6 = bitset_create();
  pbStack_90 = (bitset_t *)0x102258;
  _Var4 = bitset_empty(pbVar5);
  if (_Var4) {
    uVar14 = 0;
    do {
      uVar17 = uVar14 >> 6;
      if ((uVar14 & 1) == 0) {
        uVar9 = 0x3e;
        pbVar8 = pbVar5;
        if (uVar17 < pbVar5->arraysize) goto LAB_001022b6;
        pbStack_90 = (bitset_t *)0x10229e;
        _Var4 = bitset_grow(pbVar5,uVar17 + 1);
LAB_001022b2:
        if (_Var4 != false) goto LAB_001022b6;
      }
      else {
        uVar9 = 0x3f;
        pbVar8 = pbVar6;
        if (pbVar6->arraysize <= uVar17) {
          pbStack_90 = (bitset_t *)0x1022af;
          _Var4 = bitset_grow(pbVar6,uVar17 + 1);
          goto LAB_001022b2;
        }
LAB_001022b6:
        uVar16 = (uint)uVar9 & (uint)uVar14;
        uVar9 = (ulong)uVar16;
        pbVar8->array[uVar17] = pbVar8->array[uVar17] | 1L << (sbyte)uVar16;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != 1000);
    pbStack_90 = (bitset_t *)0x1022e2;
    _Var4 = bitsets_intersect(pbVar5,pbVar6);
    if (_Var4) goto LAB_0010235b;
    uVar9 = 0x20000000000;
    if (pbVar5->arraysize < 0x10) {
      pbStack_90 = (bitset_t *)0x102304;
      _Var4 = bitset_grow(pbVar5,0x10);
      if (_Var4) goto LAB_00102308;
    }
    else {
LAB_00102308:
      pbVar5->array[0xf] = pbVar5->array[0xf] | 0x20000000000;
    }
    if (pbVar6->arraysize < 0x10) {
      pbStack_90 = (bitset_t *)0x102323;
      _Var4 = bitset_grow(pbVar6,0x10);
      if (_Var4) goto LAB_00102327;
    }
    else {
LAB_00102327:
      pbVar6->array[0xf] = pbVar6->array[0xf] | 0x20000000000;
    }
    pbStack_90 = (bitset_t *)0x102339;
    _Var4 = bitsets_intersect(pbVar5,pbVar6);
    if (_Var4) {
      pbStack_90 = (bitset_t *)0x102345;
      bitset_free(pbVar5);
      bitset_free(pbVar6);
      return;
    }
  }
  else {
    pbStack_90 = (bitset_t *)0x10235b;
    test_intersects_cold_1();
LAB_0010235b:
    pbStack_90 = (bitset_t *)0x102360;
    test_intersects_cold_3();
  }
  pbStack_90 = (bitset_t *)test_contains_all_different_sizes;
  test_intersects_cold_2();
  pcStack_a8 = (code *)0x102373;
  pbStack_98 = pbVar5;
  pbStack_90 = pbVar6;
  pbVar5 = bitset_create_with_capacity(10);
  pcStack_a8 = (code *)0x102380;
  pbVar6 = bitset_create_with_capacity(5);
  if (pbVar5->arraysize == 0) {
    pcStack_a8 = (code *)0x102397;
    _Var4 = bitset_grow(pbVar5,1);
    if (_Var4) goto LAB_0010239b;
  }
  else {
LAB_0010239b:
    *pbVar5->array = *pbVar5->array | 2;
  }
  if (pbVar5->arraysize == 0) {
    pcStack_a8 = (code *)0x1023b6;
    _Var4 = bitset_grow(pbVar5,1);
    if (_Var4) goto LAB_001023ba;
  }
  else {
LAB_001023ba:
    *pbVar5->array = *pbVar5->array | 0x10;
  }
  if (pbVar5->arraysize == 0) {
    pcStack_a8 = (code *)0x1023d5;
    _Var4 = bitset_grow(pbVar5,1);
    if (_Var4) goto LAB_001023d9;
  }
  else {
LAB_001023d9:
    *pbVar5->array = *pbVar5->array | 0x40;
  }
  if (pbVar6->arraysize == 0) {
    pcStack_a8 = (code *)0x1023f4;
    _Var4 = bitset_grow(pbVar6,1);
    if (_Var4) goto LAB_001023f8;
  }
  else {
LAB_001023f8:
    *pbVar6->array = *pbVar6->array | 2;
  }
  if (pbVar6->arraysize == 0) {
    pcStack_a8 = (code *)0x102413;
    _Var4 = bitset_grow(pbVar6,1);
    if (_Var4) goto LAB_00102417;
  }
  else {
LAB_00102417:
    *pbVar6->array = *pbVar6->array | 0x10;
  }
  pcStack_a8 = (code *)0x102429;
  _Var4 = bitset_contains_all(pbVar5,pbVar6);
  if (_Var4) {
    pcStack_a8 = (code *)0x102438;
    _Var4 = bitset_contains_all(pbVar6,pbVar5);
    if (!_Var4) {
      pcStack_a8 = (code *)0x102444;
      bitset_free(pbVar5);
      bitset_free(pbVar6);
      return;
    }
  }
  else {
    pcStack_a8 = (code *)0x102458;
    test_contains_all_different_sizes_cold_1();
  }
  pcStack_a8 = test_contains_all;
  test_contains_all_different_sizes_cold_2();
  pcStack_d0 = (code *)0x10246a;
  pbStack_c0 = pbVar5;
  uStack_b8 = 1000;
  pbStack_b0 = pbVar6;
  pcStack_a8 = (code *)uVar9;
  pbVar5 = bitset_create();
  uVar14 = 0;
  pcStack_d0 = (code *)0x102475;
  pbVar6 = bitset_create();
  do {
    uVar17 = uVar14 >> 6;
    if (uVar17 < pbVar5->arraysize) {
LAB_00102496:
      pbVar5->array[uVar17] = pbVar5->array[uVar17] | 1L << ((byte)uVar14 & 0x3f);
    }
    else {
      pcStack_d0 = (code *)0x102492;
      _Var4 = bitset_grow(pbVar5,uVar17 + 1);
      if (_Var4) goto LAB_00102496;
    }
    if ((uVar14 & 1) == 0) {
      if (pbVar6->arraysize <= uVar17) {
        pcStack_d0 = (code *)0x1024c1;
        _Var4 = bitset_grow(pbVar6,uVar17 + 1);
        if (!_Var4) goto LAB_001024da;
      }
      pbVar6->array[uVar17] = pbVar6->array[uVar17] | 1L << ((byte)uVar14 & 0x3e);
    }
LAB_001024da:
    uVar14 = uVar14 + 1;
  } while (uVar14 != 1000);
  pcStack_d0 = (code *)0x1024f1;
  _Var4 = bitset_contains_all(pbVar5,pbVar6);
  if (_Var4) {
    pcStack_d0 = (code *)0x102500;
    _Var4 = bitset_contains_all(pbVar6,pbVar5);
    if (_Var4) goto LAB_0010256b;
    if (pbVar6->arraysize < 0x10) {
      pcStack_d0 = (code *)0x102518;
      _Var4 = bitset_grow(pbVar6,0x10);
      if (_Var4) goto LAB_0010251c;
    }
    else {
LAB_0010251c:
      pbVar6->array[0xf] = pbVar6->array[0xf] | 0x20000000000;
    }
    pcStack_d0 = (code *)0x102538;
    _Var4 = bitset_contains_all(pbVar5,pbVar6);
    if (!_Var4) {
      pcStack_d0 = (code *)0x102547;
      _Var4 = bitset_contains_all(pbVar6,pbVar5);
      if (!_Var4) {
        pcStack_d0 = (code *)0x102553;
        bitset_free(pbVar5);
        bitset_free(pbVar6);
        return;
      }
      goto LAB_00102575;
    }
  }
  else {
    pcStack_d0 = (code *)0x10256b;
    test_contains_all_cold_1();
LAB_0010256b:
    pcStack_d0 = (code *)0x102570;
    test_contains_all_cold_4();
  }
  pcStack_d0 = (code *)0x102575;
  test_contains_all_cold_3();
LAB_00102575:
  pcStack_d0 = test_next_bits_iterate;
  test_contains_all_cold_2();
  uVar17 = 0;
  pbStack_e0 = pbVar5;
  pbStack_d8 = pbVar6;
  pcStack_d0 = (code *)uVar14;
  pbVar5 = bitset_create();
  do {
    uVar14 = uVar17 >> 6;
    if (uVar14 < pbVar5->arraysize) {
LAB_001025ab:
      pbVar5->array[uVar14] = pbVar5->array[uVar14] | 1L << ((byte)uVar17 & 0x3f);
    }
    else {
      _Var4 = bitset_grow(pbVar5,uVar14 + 1);
      if (_Var4) goto LAB_001025ab;
    }
    uVar17 = uVar17 + 1;
  } while (uVar17 != 100);
  uVar14 = 0x3e6;
  do {
    uVar14 = uVar14 + 2;
    uVar17 = uVar14 >> 6;
    if (uVar17 < pbVar5->arraysize) {
LAB_001025ed:
      pbVar5->array[uVar17] = pbVar5->array[uVar17] | 1L << ((byte)uVar14 & 0x3e);
    }
    else {
      _Var4 = bitset_grow(pbVar5,uVar17 + 1);
      if (_Var4) goto LAB_001025ed;
    }
  } while (uVar14 < 0x44a);
  uVar14 = pbVar5->arraysize;
  uVar17 = 0;
  lVar13 = 0;
LAB_0010261a:
  uVar9 = uVar17 >> 6;
  if (uVar9 < uVar14) {
    puVar1 = pbVar5->array;
    uVar12 = (puVar1[uVar9] >> ((byte)uVar17 & 0x3f)) << ((byte)uVar17 & 0x3f);
    uVar11 = uVar17 & 0xffffffffffffffc0;
    uVar10 = 0;
    do {
      while (uVar12 == 0) {
        uVar9 = uVar9 + 1;
        if (uVar9 == uVar14) goto LAB_0010268b;
        uVar11 = uVar11 + 0x40;
        uVar12 = puVar1[uVar9];
        if (2 < uVar10) goto LAB_0010268b;
      }
      uVar15 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
        }
      }
      auStack_100[uVar10] = uVar15 | uVar11;
      uVar15 = uVar12 - 1;
      if (uVar10 == 2) {
        uVar15 = 0xffffffffffffffff;
      }
      uVar10 = uVar10 + 1;
      uVar12 = uVar12 & uVar15;
    } while (uVar10 != 3);
    uVar10 = 3;
LAB_0010268b:
    if (uVar10 != 0) {
      uVar17 = auStack_100[uVar10 - 1];
    }
  }
  else {
    uVar10 = 0;
  }
  if (uVar10 != 0) {
    uVar9 = lVar13 * 2 + 800;
    uVar11 = 0;
    do {
      uVar15 = lVar13 + uVar11;
      if (99 < lVar13 + uVar11) {
        uVar15 = uVar9;
      }
      if (auStack_100[uVar11] != uVar15) {
        test_next_bits_iterate_cold_1();
        goto LAB_001026f4;
      }
      uVar11 = uVar11 + 1;
      uVar9 = uVar9 + 2;
    } while (uVar10 != uVar11);
    uVar17 = uVar17 + 1;
    lVar13 = uVar10 + lVar13;
    goto LAB_0010261a;
  }
  if (lVar13 == 0x96) {
    bitset_free(pbVar5);
    return;
  }
LAB_001026f4:
  test_next_bits_iterate_cold_2();
  uVar14 = 0;
  pbVar5 = bitset_create();
  do {
    uVar17 = uVar14 >> 6;
    if ((uVar17 < pbVar5->arraysize) || (_Var4 = bitset_grow(pbVar5,uVar17 + 1), _Var4)) {
      pbVar5->array[uVar17] = pbVar5->array[uVar17] | 1L << ((byte)uVar14 & 0x3f);
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 100);
  uVar14 = 0x3e6;
  do {
    uVar14 = uVar14 + 2;
    uVar17 = uVar14 >> 6;
    if ((uVar17 < pbVar5->arraysize) || (_Var4 = bitset_grow(pbVar5,uVar17 + 1), _Var4)) {
      pbVar5->array[uVar17] = pbVar5->array[uVar17] | 1L << ((byte)uVar14 & 0x3e);
    }
  } while (uVar14 < 0x44a);
  uVar14 = 0;
  uVar17 = 0;
  do {
    uVar9 = uVar14 >> 6;
    if (uVar9 < pbVar5->arraysize) {
      uVar10 = pbVar5->array[uVar9] >> ((byte)uVar14 & 0x3f);
      if (uVar10 == 0) {
        lVar13 = uVar9 * -0x40;
        do {
          uVar9 = uVar9 + 1;
          if (pbVar5->arraysize == uVar9) goto LAB_001027e0;
          uVar10 = pbVar5->array[uVar9];
          lVar13 = lVar13 + -0x40;
        } while (uVar10 == 0);
        lVar2 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar14 = lVar2 - lVar13;
      }
      else {
        lVar13 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
        uVar14 = uVar14 + lVar13;
      }
      bVar3 = true;
    }
    else {
LAB_001027e0:
      bVar3 = false;
    }
    if (!bVar3) {
      if (uVar17 == 0x96) {
        bitset_free(pbVar5);
        return;
      }
      goto LAB_00102822;
    }
    uVar9 = uVar17 * 2 + 800;
    if (uVar17 < 100) {
      uVar9 = uVar17;
    }
    if (uVar14 != uVar9) {
      test_next_bit_iterate_cold_2();
LAB_00102822:
      test_next_bit_iterate_cold_1();
      test_next_bit_iterate();
      test_next_bits_iterate();
      test_set_to_val();
      test_construct();
      test_union_intersection();
      test_iterate();
      test_iterate2();
      test_max_min();
      test_counts();
      test_shift_right();
      test_shift_left();
      test_disjoint();
      test_intersects();
      test_contains_all();
      test_contains_all_different_sizes();
      puts("All TEST_ASSERTs passed. Code is probably ok.");
      return;
    }
    uVar17 = uVar17 + 1;
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

void test_counts() {
  bitset_t *b1 = bitset_create();
  bitset_t *b2 = bitset_create();

  for (int k = 0; k < 1000; ++k) {
    bitset_set(b1, 2 * k);
    bitset_set(b2, 3 * k);
  }
  TEST_ASSERT(bitset_intersection_count(b1, b2) == 334);
  TEST_ASSERT(bitset_union_count(b1, b2) == 1666);
  bitset_free(b1);
  bitset_free(b2);
}